

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O1

void tooltip_cb(Fl_Input *i,void *v)

{
  char *n;
  bool bVar1;
  int iVar2;
  Fl_Type *pFVar3;
  
  if ((char *)v == "LOAD") {
    iVar2 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x17])();
    if (iVar2 != 0) {
      Fl_Widget::activate((Fl_Widget *)i);
      Fl_Input_::static_value(&i->super_Fl_Input_,current_widget->tooltip_);
      return;
    }
    Fl_Widget::deactivate((Fl_Widget *)i);
    return;
  }
  if (Fl_Type::first != (Fl_Type *)0x0) {
    bVar1 = false;
    pFVar3 = Fl_Type::first;
    do {
      if (pFVar3->selected != '\0') {
        iVar2 = (*pFVar3->_vptr_Fl_Type[0x17])(pFVar3);
        if (iVar2 != 0) {
          n = (i->super_Fl_Input_).value_;
          storestring(n,&pFVar3[1].user_data_type_,0);
          Fl_Widget::tooltip((Fl_Widget *)pFVar3[1].prev,n);
          bVar1 = true;
        }
      }
      pFVar3 = pFVar3->next;
    } while (pFVar3 != (Fl_Type *)0x0);
    if (bVar1) {
      set_modflag(1);
      return;
    }
  }
  return;
}

Assistant:

void tooltip_cb(Fl_Input* i, void *v) {
  if (v == LOAD) {
    if (current_widget->is_widget()) {
      i->activate();
      i->static_value(((Fl_Widget_Type*)current_widget)->tooltip());
    } else i->deactivate();
  } else {
    int mod = 0;
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected && o->is_widget()) {
        ((Fl_Widget_Type*)o)->tooltip(i->value());
	mod = 1;
      }
    }
    if (mod) set_modflag(1);
  }
}